

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniFile.cpp
# Opt level: O3

void __thiscall asl::IniFile::IniFile(IniFile *this,String *fname,bool shouldwrite)

{
  Array<asl::String> *this_00;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  anon_union_16_2_78e7fdac_for_String_2 *paVar8;
  String *pSVar9;
  String *pSVar10;
  Dic<asl::String> *pDVar11;
  char *pcVar12;
  undefined7 in_register_00000011;
  int j;
  long lVar13;
  String line;
  String name;
  String value;
  TextFile file;
  String local_f0;
  String *local_d8;
  undefined4 local_cc;
  String local_c8;
  String *local_b0;
  Map<asl::String,_asl::String> *local_a8;
  anon_union_16_2_78e7fdac_for_String_2 *local_a0;
  String *local_98;
  String local_90;
  File local_78;
  
  local_cc = (undefined4)CONCAT71(in_register_00000011,shouldwrite);
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *)this,0);
  local_d8 = &this->_currentTitle;
  (this->_currentTitle).field_2._space[0] = '\0';
  (this->_currentTitle)._size = 0;
  (this->_currentTitle)._len = 0;
  local_b0 = &this->_filename;
  (this->_filename)._size = 0;
  (this->_filename)._len = 0;
  (this->_filename).field_2._space[0] = '\0';
  local_98 = &this->_indent;
  (this->_indent)._size = 0;
  (this->_indent)._len = 0;
  (this->_indent).field_2._space[0] = '\0';
  this_00 = &this->_lines;
  Array<asl::String>::alloc(this_00,0);
  this->_modified = false;
  if (fname->_size == 0) {
    paVar8 = &fname->field_2;
  }
  else {
    paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(fname->field_2)._str;
  }
  String::assign(local_b0,paVar8->_space,fname->_len);
  String::assign(local_d8,"-",1);
  this->_ok = false;
  this->_shouldwrite = SUB41(local_cc,0);
  TextFile::TextFile((TextFile *)&local_78,fname,READ);
  if (local_78._file != (FILE *)0x0) {
    Array<asl::String>::reserve(this_00,0x10);
    this->_ok = true;
    String::String(&local_f0,"-");
    local_a8 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                          ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&local_f0)->
                super_Map<asl::String,_asl::String>;
    if (local_f0._size != 0) {
      free(local_f0.field_2._str);
    }
    local_a0 = &(this->_currentTitle).field_2;
    do {
      bVar4 = TextFile::end((TextFile *)&local_78);
      if (bVar4) break;
      TextFile::readLine(&local_f0,(TextFile *)&local_78);
      if ((char)local_cc != '\0') {
        Array<asl::String>::insert(this_00,-1,&local_f0);
      }
      if (local_f0._len < 1) {
LAB_00130c6b:
        bVar4 = false;
      }
      else {
        bVar5 = TextFile::end((TextFile *)&local_78);
        bVar4 = true;
        if (!bVar5) {
          uVar7 = &local_f0.field_2;
          if (local_f0._size != 0) {
            uVar7 = local_f0.field_2._str;
          }
          bVar1 = *(byte *)uVar7;
          bVar2 = bVar1;
          while ((char)bVar2 < '!') {
            uVar7 = uVar7 + 1;
            if ((0x20 < bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
            bVar2 = *(byte *)uVar7;
          }
          if (bVar1 == 0x5b) {
            iVar6 = String::indexOf(&local_f0,']',1);
            if (-1 < iVar6) {
              String::substring(&local_c8,&local_f0,1,iVar6);
              local_a8 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                                    ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&local_c8)->
                          super_Map<asl::String,_asl::String>;
              paVar8 = local_a0;
              if (local_d8->_size != 0) {
                paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)local_a0->_str;
              }
              if ((paVar8->_space[0] == '-') && (paVar8->_space[1] == '\0')) {
                uVar7 = &local_c8.field_2;
                if (local_c8._size != 0) {
                  uVar7 = local_c8.field_2._str;
                }
                String::assign(local_d8,(char *)uVar7,local_c8._len);
              }
LAB_00130c5a:
              if (local_c8._size != 0) {
                free(local_c8.field_2._str);
              }
            }
          }
          else if (bVar2 != 0x3b && '/' < (char)bVar2) {
            iVar6 = String::indexOf(&local_f0,'=',0);
            if (0 < iVar6) {
              if (((this->_indent)._len < 1) && (0 < local_f0._len)) {
                lVar13 = 0;
                do {
                  uVar7 = &local_f0.field_2;
                  if (local_f0._size != 0) {
                    uVar7 = local_f0.field_2._str;
                  }
                  bVar1 = *(byte *)(uVar7 + lVar13);
                  if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
                     ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) break;
                  String::operator+=(local_98,bVar1);
                  lVar13 = lVar13 + 1;
                } while (lVar13 < local_f0._len);
              }
              String::substring(&local_c8,&local_f0,0,iVar6);
              String::substring(&local_90,&local_f0,iVar6 + 1,local_f0._len);
              pSVar9 = String::trim(&local_90);
              pSVar10 = String::trim(&local_c8);
              pSVar10 = String::replaceme(pSVar10,'/','\\');
              pSVar10 = Map<asl::String,_asl::String>::operator[](local_a8,pSVar10);
              if (pSVar9->_size == 0) {
                paVar8 = &pSVar9->field_2;
              }
              else {
                paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar9->field_2)._str;
              }
              String::assign(pSVar10,paVar8->_space,pSVar9->_len);
              if (local_90._size != 0) {
                free(local_90.field_2._str);
              }
              goto LAB_00130c5a;
            }
            iVar6 = *(int *)&this_00->_a[-1].field_2;
            if ((0 < (long)iVar6) && (0 < this_00->_a[(long)iVar6 + -1]._len)) {
              Array<asl::String>::resize(this_00,iVar6 + -1);
            }
          }
          goto LAB_00130c6b;
        }
      }
      if (local_f0._size != 0) {
        free(local_f0.field_2._str);
      }
    } while (!bVar4);
    uVar3 = *(uint *)&this_00->_a[-1].field_2;
    iVar6 = uVar3 + 1;
    lVar13 = (ulong)uVar3 * 0x18 + -0x10;
    while (iVar6 = iVar6 + -1, 1 < iVar6) {
      pSVar9 = this_00->_a;
      if (*(int *)((long)pSVar9 + lVar13 + -8) == 0) {
        pcVar12 = (char *)((long)&pSVar9->_size + lVar13);
      }
      else {
        pcVar12 = *(char **)((long)&pSVar9->_size + lVar13);
      }
      if (*pcVar12 != '\0') break;
      lVar13 = lVar13 + -0x18;
      Array<asl::String>::resize(this_00,*(int *)&pSVar9[-1].field_2 + -1);
    }
    String::String(&local_f0,"-");
    pDVar11 = Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&local_f0);
    iVar6 = *(int *)&(pDVar11->super_Map<asl::String,_asl::String>).a._a[-1].value.field_2;
    if (local_f0._size != 0) {
      free(local_f0.field_2._str);
    }
    if (iVar6 == 0) {
      String::String(&local_f0,"-");
      Map<asl::String,_asl::Dic<asl::String>_>::remove
                ((Map<asl::String,_asl::Dic<asl::String>_> *)this,(char *)&local_f0);
      if (local_f0._size != 0) {
        free(local_f0.field_2._str);
      }
    }
    else {
      String::assign(local_d8,"-",1);
    }
  }
  File::~File(&local_78);
  return;
}

Assistant:

IniFile::IniFile(const String& fname, bool shouldwrite)
{
	_modified = false;
	_filename = fname;
	_currentTitle = NOSECTION;
	_ok = false;
	_shouldwrite = shouldwrite;
	TextFile file(fname, File::READ);
	if(!file) {
		return;
	}
	_lines.reserve(16);
	_ok = true;
	Section* cursection = &_sections[NOSECTION];
	while(!file.end())
	{
		String line=file.readLine();
		if (shouldwrite)
			_lines << line;
		if(!line.ok())
			continue;
		if(file.end())
			break;

		int i0 = 0;
		while (myisspace(line[i0]) && line[i0] != '\0')
			i0++;

		if (line[0] == '[')
		{
			int end = line.indexOf(']', 1);
			if(end < 0)
				continue;
			String name = line.substring(1, end);
			cursection = &_sections[name];
			if (_currentTitle == NOSECTION)
				_currentTitle = name;
		}
		else if(line[i0] != '#' && line[i0] > 47 && line[i0] != ';')
		{
			int i = line.indexOf('=');
			if (i < 1)
			{
				if (_lines.length() > 0 && _lines.last().ok())
					_lines.resize(_lines.length() - 1);
				continue;
			}
			if (!_indent.ok())
				for (int j = 0; j < line.length(); j++)
				{
					if (myisspace(line[j]))
						_indent += line[j];
					else
						break;
				}
			String key = line.substring(0,i);
			String value = line.substring(i+1);
			(*cursection)[key.trim().replaceme('/', '\\')] = value.trim();
		}
	}
	
	for(int i=_lines.length()-1; i>0 && _lines[i][0] == '\0'; i--)
	{
		_lines.resize(_lines.length()-1);
	}
	if (_sections[NOSECTION].length() == 0)
		_sections.remove(NOSECTION);
	else
		_currentTitle = NOSECTION;
}